

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recursive_cte_node.cpp
# Opt level: O2

string * __thiscall
duckdb::RecursiveCTENode::ToString_abi_cxx11_(string *__return_storage_ptr__,RecursiveCTENode *this)

{
  pointer pQVar1;
  string sStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  CommonTableExpressionMap::ToString_abi_cxx11_(&sStack_78,&(this->super_QueryNode).cte_map);
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_78);
  ::std::__cxx11::string::~string((string *)&sStack_78);
  pQVar1 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                     (&this->left);
  (*pQVar1->_vptr_QueryNode[3])(&local_58,pQVar1);
  ::std::operator+(&local_38,"(",&local_58);
  ::std::operator+(&sStack_78,&local_38,")");
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&sStack_78);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (this->union_all == true) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  pQVar1 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                     (&this->right);
  (*pQVar1->_vptr_QueryNode[3])(&local_58,pQVar1);
  ::std::operator+(&local_38,"(",&local_58);
  ::std::operator+(&sStack_78,&local_38,")");
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&sStack_78);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

string RecursiveCTENode::ToString() const {
	string result;
	result = cte_map.ToString();
	result += "(" + left->ToString() + ")";
	result += " UNION ";
	if (union_all) {
		result += " ALL ";
	}
	result += "(" + right->ToString() + ")";
	return result;
}